

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

bool __thiscall BufferedFile::Fill(BufferedFile *this)

{
  long lVar1;
  pointer pbVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  size_t sVar7;
  error_code *this_00;
  char *pcVar8;
  AutoFile *in_RDI;
  long in_FS_OFFSET;
  Span<std::byte> SVar9;
  Span<std::byte> in_stack_00000000;
  size_t nBytes;
  uint nAvail;
  uint readNow;
  uint pos;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  io_errc in_stack_ffffffffffffff54;
  Span<std::byte> *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  error_code *peVar10;
  Span<std::byte> *in_stack_ffffffffffffff68;
  FILE *local_60;
  uint local_40;
  AutoFile *this_01;
  bool local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (in_RDI->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = in_RDI;
  sVar5 = std::vector<std::byte,_std::allocator<std::byte>_>::size(in_stack_ffffffffffffff48);
  sVar6 = std::vector<std::byte,_std::allocator<std::byte>_>::size(in_stack_ffffffffffffff48);
  local_40 = (int)sVar6 - (int)((ulong)pbVar2 % sVar5);
  sVar5 = std::vector<std::byte,_std::allocator<std::byte>_>::size(in_stack_ffffffffffffff48);
  uVar3 = ((int)sVar5 -
          ((int)(in_RDI->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start -
          (int)(in_RDI->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish)) -
          (int)(in_RDI->m_position).super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload._M_value;
  if (uVar3 < local_40) {
    local_40 = uVar3;
  }
  if (local_40 == 0) {
    local_29 = false;
  }
  else {
    Span<std::byte>::Span<std::vector<std::byte,std::allocator<std::byte>>>
              (in_stack_ffffffffffffff58,
               (vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    SVar9 = Span<std::byte>::subspan
                      (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                       (size_t)in_stack_ffffffffffffff58);
    local_60 = (FILE *)SVar9.m_data;
    sVar7 = AutoFile::detail_fread(this_01,in_stack_00000000);
    if (sVar7 == 0) {
      this_00 = (error_code *)__cxa_allocate_exception(0x20);
      peVar10 = this_00;
      iVar4 = AutoFile::feof((AutoFile *)in_RDI->m_file,local_60);
      pcVar8 = "BufferedFile::Fill: fread failed";
      if ((char)iVar4 != '\0') {
        pcVar8 = "BufferedFile::Fill: end of file";
      }
      std::error_code::error_code<std::io_errc,void>(this_00,in_stack_ffffffffffffff54);
      std::ios_base::failure[abi:cxx11]::failure((char *)peVar10,(error_code *)pcVar8);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this_00,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_0082a442;
    }
    (in_RDI->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (in_RDI->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start + sVar7;
    local_29 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
LAB_0082a442:
  __stack_chk_fail();
}

Assistant:

bool Fill() {
        unsigned int pos = nSrcPos % vchBuf.size();
        unsigned int readNow = vchBuf.size() - pos;
        unsigned int nAvail = vchBuf.size() - (nSrcPos - m_read_pos) - nRewind;
        if (nAvail < readNow)
            readNow = nAvail;
        if (readNow == 0)
            return false;
        size_t nBytes{m_src.detail_fread(Span{vchBuf}.subspan(pos, readNow))};
        if (nBytes == 0) {
            throw std::ios_base::failure{m_src.feof() ? "BufferedFile::Fill: end of file" : "BufferedFile::Fill: fread failed"};
        }
        nSrcPos += nBytes;
        return true;
    }